

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> *
__thiscall
testing::internal::
MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
          (PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>
           *__return_storage_ptr__,internal *this,UnorderedElementsAreArrayMatcher<int> *matcher)

{
  UnorderedElementsAreArrayMatcher<int> local_38;
  internal *local_18;
  UnorderedElementsAreArrayMatcher<int> *matcher_local;
  
  local_18 = this;
  matcher_local = &__return_storage_ptr__->matcher_;
  UnorderedElementsAreArrayMatcher<int>::UnorderedElementsAreArrayMatcher
            (&local_38,(UnorderedElementsAreArrayMatcher<int> *)this);
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  PredicateFormatterFromMatcher(__return_storage_ptr__,&local_38);
  UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline PredicateFormatterFromMatcher<M> MakePredicateFormatterFromMatcher(
    M matcher) {
  return PredicateFormatterFromMatcher<M>(std::move(matcher));
}